

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_stdio.cpp
# Opt level: O0

int os_get_event(unsigned_long timeout,int use_timeout,os_event_info_t *info)

{
  int iVar1;
  int *in_RDX;
  int in_ESI;
  int local_4;
  
  if (in_ESI == 0) {
    iVar1 = os_getc_raw();
    *in_RDX = iVar1;
    if (*in_RDX == 0) {
      iVar1 = os_getc_raw();
      in_RDX[1] = iVar1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int os_get_event(unsigned long timeout, int use_timeout,
                 os_event_info_t *info)
{
    /* we can't handle timeouts */
    if (use_timeout)
        return OS_EVT_NOTIMEOUT;

    /* get a key */
    info->key[0] = os_getc_raw();
    if (info->key[0] == 0)
        info->key[1] = os_getc_raw();

    /* return the keyboard event */
    return OS_EVT_KEY;
}